

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boolean.cpp
# Opt level: O0

Variable __thiscall LiteScript::_Type_BOOLEAN::Convert(_Type_BOOLEAN *this,Variable *obj,Type *type)

{
  bool bVar1;
  bool *pbVar2;
  Number *this_00;
  String *this_01;
  Object *pOVar3;
  undefined1 in_CL;
  undefined7 in_register_00000009;
  uint *extraout_RDX;
  uint *extraout_RDX_00;
  uint *extraout_RDX_01;
  Variable VVar5;
  Variable local_90 [2];
  String local_70;
  undefined1 local_49;
  Number local_48;
  undefined1 local_3d;
  undefined1 local_29;
  Type *local_28;
  Type *type_local;
  Variable *obj_local;
  _Type_BOOLEAN *this_local;
  Variable *res;
  uint *puVar4;
  
  local_28 = (Type *)CONCAT71(in_register_00000009,in_CL);
  type_local = type;
  obj_local = obj;
  this_local = this;
  bVar1 = Type::operator==(local_28,(Type *)_type_boolean);
  if (bVar1) {
    local_29 = 0;
    pOVar3 = Variable::operator->((Variable *)type_local);
    Memory::Create((Memory *)this,(Type *)pOVar3->memory);
    pOVar3 = Variable::operator->((Variable *)type_local);
    pbVar2 = Object::GetData<bool>(pOVar3);
    bVar1 = *pbVar2;
    pOVar3 = Variable::operator->((Variable *)this);
    pbVar2 = Object::GetData<bool>(pOVar3);
    *pbVar2 = (bool)(bVar1 & 1);
    puVar4 = extraout_RDX;
  }
  else {
    bVar1 = Type::operator==(local_28,(Type *)_type_number);
    if (bVar1) {
      local_3d = 0;
      pOVar3 = Variable::operator->((Variable *)type_local);
      Memory::Create((Memory *)this,(Type *)pOVar3->memory);
      pOVar3 = Variable::operator->((Variable *)type_local);
      pbVar2 = Object::GetData<bool>(pOVar3);
      Number::Number(&local_48,*pbVar2 & 1);
      pOVar3 = Variable::operator->((Variable *)this);
      this_00 = Object::GetData<LiteScript::Number>(pOVar3);
      Number::operator=(this_00,&local_48);
      puVar4 = extraout_RDX_00;
    }
    else {
      bVar1 = Type::operator==(local_28,(Type *)_type_string);
      if (bVar1) {
        local_49 = 0;
        pOVar3 = Variable::operator->((Variable *)type_local);
        Memory::Create((Memory *)this,(Type *)pOVar3->memory);
        Variable::operator_cast_to_string(local_90);
        String::String(&local_70,(string *)local_90);
        pOVar3 = Variable::operator->((Variable *)this);
        this_01 = Object::GetData<LiteScript::String>(pOVar3);
        String::operator=(this_01,&local_70);
        String::~String(&local_70);
        std::__cxx11::string::~string((string *)local_90);
        puVar4 = extraout_RDX_01;
      }
      else {
        pOVar3 = Variable::operator->((Variable *)type_local);
        VVar5 = Memory::Create((Memory *)this,(Type *)pOVar3->memory);
        puVar4 = VVar5.nb_ref;
      }
    }
  }
  VVar5.nb_ref = puVar4;
  VVar5.obj = (Object *)this;
  return VVar5;
}

Assistant:

LiteScript::Variable LiteScript::_Type_BOOLEAN::Convert(const LiteScript::Variable& obj, const LiteScript::Type& type) const {
    if (type == Type::BOOLEAN) {
        Variable res = obj->memory.Create(Type::BOOLEAN);
        res->GetData<bool>() = obj->GetData<bool>();
        return res;
    }
    else if (type == Type::NUMBER) {
        Variable res = obj->memory.Create(Type::NUMBER);
        res->GetData<Number>() = Number(obj->GetData<bool>() ? 1 : 0);
        return res;
    }
    else if (type == Type::STRING) {
        Variable res = obj->memory.Create(Type::STRING);
        res->GetData<String>() = String((std::string)(obj));
        return res;
    }
    else {
        return obj->memory.Create(Type::NIL);
    }
}